

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileIsSymlink(string *name)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [8];
  stat_conflict fs;
  string *name_local;
  
  fs.__glibc_reserved[2] = (__syscall_slong_t)name;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = lstat(__file,(stat *)local_a8);
  name_local._7_1_ = iVar1 == 0 && ((uint)fs.st_nlink & 0xf000) == 0xa000;
  return name_local._7_1_;
}

Assistant:

bool SystemTools::FileIsSymlink(const std::string& name)
{
#if defined(_WIN32)
  std::wstring path = Encoding::ToWindowsExtendedPath(name);
  return FileIsSymlinkWithAttr(path, GetFileAttributesW(path.c_str()));
#else
  struct stat fs;
  if (lstat(name.c_str(), &fs) == 0) {
    return S_ISLNK(fs.st_mode);
  } else {
    return false;
  }
#endif
}